

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_reader.cc
# Opt level: O0

void __thiscall
lf::io::GmshReader::GmshReader
          (GmshReader *this,
          unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *factory,
          string *filename)

{
  variant<lf::io::GMshFileV2,_lf::io::GMshFileV4> local_1e0;
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> local_28;
  string *local_20;
  string *filename_local;
  unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *factory_local;
  GmshReader *this_local;
  
  local_20 = filename;
  filename_local = (string *)factory;
  factory_local =
       (unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *)this;
  std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::unique_ptr
            (&local_28,factory);
  ReadGmshFile(&local_1e0,local_20);
  GmshReader(this,&local_28,&local_1e0);
  std::variant<lf::io::GMshFileV2,_lf::io::GMshFileV4>::~variant(&local_1e0);
  std::unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>::~unique_ptr
            (&local_28);
  return;
}

Assistant:

GmshReader::GmshReader(std::unique_ptr<mesh::MeshFactory> factory,
                       const std::string& filename)
    : GmshReader(std::move(factory), ReadGmshFile(filename)) {}